

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall
libcellml::Importer::ImporterImpl::checkUnitsForCycles
          (ImporterImpl *this,UnitsPtr *units,History *history)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  IssueImpl *pIVar2;
  AnyCellmlElementImpl *pAVar3;
  bool bVar4;
  element_type *peVar5;
  size_t sVar6;
  element_type *this_00;
  string *psVar7;
  element_type *peVar8;
  element_type *peVar9;
  ImportedEntity local_390;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [8];
  IssuePtr issue_1;
  UnitsPtr importedUnits;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  IssuePtr issue;
  undefined1 local_170 [8];
  ModelPtr model;
  string local_158;
  ImportedEntity local_138;
  string local_128;
  UnitsConstPtr local_108;
  undefined1 local_f8 [8];
  HistoryEpochPtr h;
  undefined1 local_d8 [8];
  ModelPtr unitsModel;
  undefined1 local_b8 [8];
  string resolvingUrl;
  Model local_90;
  shared_ptr<const_libcellml::ParentedEntity> local_70;
  undefined1 local_60 [8];
  ModelPtr model_1;
  string ref;
  size_t index;
  History *history_local;
  UnitsPtr *units_local;
  ImporterImpl *this_local;
  
  peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  bVar4 = ImportedEntity::isImport(&peVar5->super_ImportedEntity);
  if (bVar4) {
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               units);
    p_Var1 = &unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    ImportedEntity::importSource((ImportedEntity *)p_Var1);
    resolvingUrl_abi_cxx11_((string *)local_b8,this,(ImportSourcePtr *)p_Var1);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)
               &unitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var1 = &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)p_Var1,units);
    owningModel((libcellml *)local_d8,(ParentedEntityConstPtr *)p_Var1);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<const_libcellml::ParentedEntity> *)
               &h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::Units_const>::shared_ptr<libcellml::Units,void>
              ((shared_ptr<libcellml::Units_const> *)&local_108,units);
    modelUrl_abi_cxx11_(&local_128,this,(ModelPtr *)local_d8);
    createHistoryEpoch((libcellml *)local_f8,&local_108,&local_128,(string *)local_b8);
    std::__cxx11::string::~string((string *)&local_128);
    std::shared_ptr<const_libcellml::Units>::~shared_ptr(&local_108);
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               units);
    ImportedEntity::importSource(&local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"flatten",
               (allocator<char> *)
               ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    bVar4 = checkForImportCycles
                      (this,(ImportSourcePtr *)&local_138,history,(HistoryEpochPtr *)local_f8,
                       &local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_138);
    if (bVar4) {
      this_local._7_1_ = true;
      resolvingUrl.field_2._12_4_ = 1;
    }
    else {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::push_back(history,(value_type *)local_f8);
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 units);
      ImportedEntity::importSource
                ((ImportedEntity *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      ImportSource::model((ImportSource *)local_170);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                ((shared_ptr<libcellml::ImportSource> *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      bVar4 = std::operator==((shared_ptr<libcellml::Model> *)local_170,(nullptr_t)0x0);
      if (bVar4) {
        Issue::IssueImpl::create();
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_190);
        pIVar2 = peVar8->mPimpl;
        peVar5 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        NamedEntity::name_abi_cxx11_(&local_230,&peVar5->super_NamedEntity);
        std::operator+(&local_210,"Units \'",&local_230);
        std::operator+(&local_1f0,&local_210,"\' requires a model imported from \'");
        std::operator+(&local_1d0,&local_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
        std::operator+(&local_1b0,&local_1d0,"\' which is not available in the importer.");
        Issue::IssueImpl::setDescription(pIVar2,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_190);
        peVar9 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar8->mPimpl->mItem);
        pAVar3 = peVar9->mPimpl;
        std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)units);
        ImportedEntity::importSource
                  ((ImportedEntity *)
                   &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                  (pAVar3,(ImportSourcePtr *)
                          &importedUnits.
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                  ((shared_ptr<libcellml::ImportSource> *)
                   &importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        peVar8 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_190);
        Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,IMPORTER_NULL_MODEL);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_190);
        this_local._7_1_ = true;
        resolvingUrl.field_2._12_4_ = 1;
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_190);
      }
      else {
        psVar7 = (string *)
                 std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_170);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        ImportedEntity::importReference_abi_cxx11_
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&peVar5->super_ImportedEntity);
        Model::units((Model *)&stack0xfffffffffffffdb0,psVar7);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar4 = std::operator==((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffdb0,
                                (nullptr_t)0x0);
        if (bVar4) {
          Issue::IssueImpl::create();
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
          pIVar2 = peVar8->mPimpl;
          peVar5 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          NamedEntity::name_abi_cxx11_(&local_360,&peVar5->super_NamedEntity);
          std::operator+(&local_340,"Units \'",&local_360);
          std::operator+(&local_320,&local_340,"\' imports units named \'");
          peVar5 = std::
                   __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)units);
          ImportedEntity::importReference_abi_cxx11_(&local_380,&peVar5->super_ImportedEntity);
          std::operator+(&local_300,&local_320,&local_380);
          std::operator+(&local_2e0,&local_300,"\' from the model imported from \'");
          std::operator+(&local_2c0,&local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_2a0,&local_2c0,"\'. The units could not be found.");
          Issue::IssueImpl::setDescription(pIVar2,&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
          peVar9 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar8->mPimpl->mItem);
          pAVar3 = peVar9->mPimpl;
          std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)units);
          ImportedEntity::importSource(&local_390);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource
                    (pAVar3,(ImportSourcePtr *)&local_390);
          std::shared_ptr<libcellml::ImportSource>::~shared_ptr
                    ((shared_ptr<libcellml::ImportSource> *)&local_390);
          peVar8 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_280);
          Issue::IssueImpl::setReferenceRule(peVar8->mPimpl,IMPORTER_MISSING_UNITS);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_280);
          this_local._7_1_ = true;
          resolvingUrl.field_2._12_4_ = 1;
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_280);
        }
        else {
          this_local._7_1_ = checkUnitsForCycles(this,(UnitsPtr *)&stack0xfffffffffffffdb0,history);
          resolvingUrl.field_2._12_4_ = 1;
        }
        std::shared_ptr<libcellml::Units>::~shared_ptr
                  ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffffdb0);
      }
      std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_170);
    }
    std::shared_ptr<libcellml::HistoryEpoch>::~shared_ptr
              ((shared_ptr<libcellml::HistoryEpoch> *)local_f8);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_d8);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    ref.field_2._8_8_ = 0;
    while( true ) {
      peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      sVar6 = Units::unitCount(peVar5);
      if (sVar6 <= (ulong)ref.field_2._8_8_) break;
      peVar5 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
      Units::unitAttributeReference_abi_cxx11_
                ((string *)
                 &model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,peVar5,ref.field_2._8_8_);
      std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
                ((shared_ptr<libcellml::ParentedEntity_const> *)&local_70,units);
      owningModel((libcellml *)local_60,(ParentedEntityConstPtr *)&local_70);
      std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_70);
      this_00 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_60);
      bVar4 = Model::hasUnits(this_00,(string *)
                                      &model_1.
                                       super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
      if (bVar4) {
        psVar7 = (string *)
                 std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_60);
        Model::units(&local_90,psVar7);
        bVar4 = checkUnitsForCycles(this,(UnitsPtr *)&local_90,history);
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&local_90);
        if (!bVar4) goto LAB_0030c640;
        this_local._7_1_ = 1;
        resolvingUrl.field_2._12_4_ = 1;
      }
      else {
LAB_0030c640:
        resolvingUrl.field_2._12_4_ = 0;
      }
      std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_60);
      std::__cxx11::string::~string
                ((string *)
                 &model_1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (resolvingUrl.field_2._12_4_ != 0) goto LAB_0030d0bf;
      ref.field_2._8_8_ = ref.field_2._8_8_ + 1;
    }
    this_local._7_1_ = 0;
  }
LAB_0030d0bf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Importer::ImporterImpl::checkUnitsForCycles(const UnitsPtr &units, History &history)
{
    // Even if these units are not imported, they might have imported children.
    if (!units->isImport()) {
        for (size_t index = 0; index < units->unitCount(); ++index) {
            std::string ref = units->unitAttributeReference(index);
            // If the child units are imported, check them too.
            auto model = owningModel(units);
            if (model->hasUnits(ref)) {
                if (checkUnitsForCycles(model->units(ref), history)) {
                    return true;
                }
            }
        }
        return false;
    }

    // If they are imported, then they can't have any child unit elements anyway.
    std::string resolvingUrl = ImporterImpl::resolvingUrl(units->importSource());
    auto unitsModel = owningModel(units);
    auto h = createHistoryEpoch(units, modelUrl(unitsModel), resolvingUrl);

    if (checkForImportCycles(units->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = units->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedUnits = model->units(units->importReference());
    if (importedUnits == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' imports units named '" + units->importReference() + "' from the model imported from '" + resolvingUrl + "'. The units could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_UNITS);
        addIssue(issue);
        return true;
    }

    return checkUnitsForCycles(importedUnits, history);
}